

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multiqueues.h
# Opt level: O3

int __thiscall
Multiqueues<int>::getQueueIndexForDelete(Multiqueues<int> *this,int queueIndex,int secondQueueIndex)

{
  PriorityQueue *pPVar1;
  pointer p_Var2;
  int iVar3;
  int iVar4;
  
  pPVar1 = this->internalQueues;
  if (pPVar1[queueIndex].super_type.q_.q_.
      super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      pPVar1[queueIndex].super_type.q_.q_.
      super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (pPVar1[secondQueueIndex].super_type.q_.q_.
        super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        pPVar1[secondQueueIndex].super_type.q_.q_.
        super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return -1;
    }
  }
  else {
    do {
      iVar3 = pthread_mutex_trylock((pthread_mutex_t *)(this->locks + queueIndex));
    } while (iVar3 != 0);
    p_Var2 = this->internalQueues[queueIndex].super_type.q_.q_.
             super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (p_Var2 == this->internalQueues[queueIndex].super_type.q_.q_.
                  super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      iVar3 = -1;
    }
    else {
      iVar3 = *(int *)&p_Var2->_M_node[1]._M_next;
    }
    pthread_mutex_unlock((pthread_mutex_t *)(this->locks + queueIndex));
    do {
      iVar4 = pthread_mutex_trylock((pthread_mutex_t *)(this->locks + secondQueueIndex));
    } while (iVar4 != 0);
    p_Var2 = this->internalQueues[secondQueueIndex].super_type.q_.q_.
             super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (p_Var2 == this->internalQueues[secondQueueIndex].super_type.q_.q_.
                  super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      iVar4 = -1;
    }
    else {
      iVar4 = *(int *)&p_Var2->_M_node[1]._M_next;
    }
    pthread_mutex_unlock((pthread_mutex_t *)(this->locks + secondQueueIndex));
    if (iVar4 <= iVar3) {
      secondQueueIndex = queueIndex;
    }
  }
  if (secondQueueIndex != -1) {
    if (this->internalQueues[secondQueueIndex].super_type.q_.q_.
        super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        this->internalQueues[secondQueueIndex].super_type.q_.q_.
        super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return -1;
    }
    return secondQueueIndex;
  }
  return -1;
}

Assistant:

int getQueueIndexForDelete(int queueIndex, int secondQueueIndex) const {
        if (internalQueues[queueIndex].empty() && internalQueues[secondQueueIndex].empty()) {
            return -1;
        } else if (internalQueues[queueIndex].empty() && !internalQueues[secondQueueIndex].empty()) {
            queueIndex = secondQueueIndex;
        } else {
            while (!locks[queueIndex].try_lock());
            int value = -1;
            if (!internalQueues[queueIndex].empty())
                value = internalQueues[queueIndex].top();
            locks[queueIndex].unlock();
            while (!locks[secondQueueIndex].try_lock());
            int value2 = -1;
            if (!internalQueues[secondQueueIndex].empty())
                value2 = internalQueues[secondQueueIndex].top();
            locks[secondQueueIndex].unlock();
            if (value2 > value) {
                queueIndex = secondQueueIndex;
            }
        }

        if (queueIndex != -1 && internalQueues[queueIndex].empty()) {
            return -1;
        }
        return queueIndex;
    }